

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  snd_pcm_t *psVar1;
  snd_pcm_t *psVar2;
  bool bVar3;
  ulong *puVar4;
  int iVar5;
  int *piVar6;
  int queryPlayback;
  uint uVar7;
  ulong uVar8;
  pollfd *pfds;
  ulong numFrames;
  char *format;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int pollCapture;
  int pollPlayback;
  int pollTimeout;
  int local_6c;
  uint local_68;
  uint local_64;
  ulong *local_60;
  int local_54;
  PaAlsaStreamComponent *local_50;
  pollfd *local_48;
  PaAlsaStreamComponent *local_40;
  int *local_38;
  
  psVar1 = (self->playback).pcm;
  local_64 = (uint)(psVar1 != (snd_pcm_t *)0x0);
  psVar2 = (self->capture).pcm;
  local_68 = (uint)(psVar2 != (snd_pcm_t *)0x0);
  local_54 = self->pollTimeout;
  local_6c = 0;
  local_60 = framesAvail;
  local_38 = xrunOccurred;
  if (self->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,local_68,local_64,framesAvail,&local_6c);
    if (-1 < paUtilErr_) {
      if (local_6c == 0) {
        if (*local_60 != 0) {
          if ((self->capture).pcm != (snd_pcm_t *)0x0) {
            (self->capture).ready = 1;
          }
          uVar7 = 0;
          iVar5 = local_6c;
          if ((self->playback).pcm != (snd_pcm_t *)0x0) {
            (self->playback).ready = 1;
          }
          goto LAB_0011186f;
        }
        goto LAB_001114b2;
      }
LAB_001117fd:
      uVar7 = 0;
      iVar5 = local_6c;
      goto LAB_0011186f;
    }
    format = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3768\n"
    ;
  }
  else {
LAB_001114b2:
    local_50 = &self->capture;
    if (psVar1 != (snd_pcm_t *)0x0 || psVar2 != (snd_pcm_t *)0x0) {
      local_40 = &self->playback;
      uVar9 = 0;
      uVar7 = (uint)(psVar1 != (snd_pcm_t *)0x0);
      uVar10 = (uint)(psVar2 != (snd_pcm_t *)0x0);
      do {
        pthread_testcancel();
        if (uVar10 == 0) {
          local_48 = (pollfd *)0x0;
          if (uVar7 != 0) {
            uVar11 = 0;
            uVar8 = 0;
            goto LAB_00111530;
          }
          uVar11 = 0;
LAB_00111574:
          bVar3 = true;
          pfds = (pollfd *)0x0;
        }
        else {
          local_48 = self->pfds;
          snd_pcm_poll_descriptors((self->capture).pcm,local_48,(self->capture).nfds);
          (self->capture).ready = 0;
          paUtilErr_ = 0;
          uVar11 = (self->capture).nfds;
          uVar8 = (ulong)uVar11;
          if (uVar7 == 0) goto LAB_00111574;
LAB_00111530:
          pfds = self->pfds + uVar8;
          snd_pcm_poll_descriptors((self->playback).pcm,pfds,(self->playback).nfds);
          bVar3 = false;
          (self->playback).ready = 0;
          paUtilErr_ = 0;
          uVar11 = uVar11 + (self->playback).nfds;
        }
        if (self->callbackMode != 0) {
          pthread_setcancelstate(0,(int *)0x0);
        }
        iVar5 = poll((pollfd *)self->pfds,(long)(int)uVar11,local_54);
        if (self->callbackMode != 0) {
          pthread_setcancelstate(1,(int *)0x0);
        }
        if (iVar5 < 0) {
          piVar6 = __errno_location();
          if (*piVar6 != 4) {
            paUtilErr_ = -0x2702;
            format = 
            "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3836\n"
            ;
            goto LAB_0011184f;
          }
          Pa_Sleep(1);
        }
        else {
          if (iVar5 == 0) {
            uVar7 = uVar9 + 1;
            if ((0 < (int)uVar9) && (Pa_Sleep(1), 0x7fe < uVar9)) {
              *local_60 = 0;
              uVar7 = 0;
              iVar5 = 1;
              goto LAB_0011186f;
            }
          }
          else {
            if ((uVar10 != 0) &&
               (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                       (local_50,local_48,(int *)&local_68,&local_6c),
               paUtilErr_ < 0)) {
              format = 
              "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3871\n"
              ;
              goto LAB_0011184f;
            }
            if ((!bVar3) &&
               (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                       (local_40,pfds,(int *)&local_64,&local_6c), paUtilErr_ < 0))
            {
              format = 
              "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3875\n"
              ;
              goto LAB_0011184f;
            }
            uVar7 = 0;
            iVar5 = local_6c;
            if (local_6c != 0) goto LAB_0011186f;
          }
          uVar9 = uVar7;
          if (((self->capture).pcm != (snd_pcm_t *)0x0) &&
             ((self->playback).pcm != (snd_pcm_t *)0x0)) {
            if (local_64 == 0 && local_68 != 0) {
              paUtilErr_ = ContinuePoll(self,StreamDirection_In,&local_54,(int *)&local_68);
              if (paUtilErr_ < 0) {
                format = 
                "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3891\n"
                ;
                goto LAB_0011184f;
              }
            }
            else if ((local_68 == 0 && local_64 != 0) &&
                    (paUtilErr_ = ContinuePoll(self,StreamDirection_Out,&local_54,(int *)&local_64),
                    paUtilErr_ < 0)) {
              format = 
              "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3895\n"
              ;
              goto LAB_0011184f;
            }
          }
        }
        uVar7 = local_64;
        uVar10 = local_68;
      } while (local_68 != 0 || local_64 != 0);
      if (local_6c != 0) goto LAB_001117fd;
    }
    queryPlayback = 0;
    iVar5 = 0;
    if ((self->capture).pcm != (snd_pcm_t *)0x0) {
      iVar5 = (self->capture).ready;
    }
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      queryPlayback = (self->playback).ready;
    }
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,iVar5,queryPlayback,local_60,&local_6c);
    puVar4 = local_60;
    if (-1 < paUtilErr_) {
      uVar10 = 0;
      uVar7 = 0;
      iVar5 = local_6c;
      if (((((self->capture).pcm != (snd_pcm_t *)0x0) && ((self->playback).pcm != (snd_pcm_t *)0x0))
          && (uVar7 = uVar10, (self->playback).ready == 0)) && (self->neverDropInput == 0)) {
        uVar8 = (self->capture).framesPerPeriod;
        numFrames = *local_60;
        if (uVar8 < *local_60) {
          numFrames = uVar8;
        }
        PaAlsaStreamComponent_EndProcessing(local_50,numFrames,&local_6c);
        *puVar4 = 0;
        (self->capture).ready = 0;
        iVar5 = local_6c;
      }
      goto LAB_0011186f;
    }
    format = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3909\n"
    ;
  }
LAB_0011184f:
  PaUtil_DebugPrint(format);
  uVar7 = paUtilErr_;
  iVar5 = local_6c;
LAB_0011186f:
  do {
    if (iVar5 != 0) {
      paUtilErr_ = PaAlsaStream_HandleXrun(self);
      if (-1 < paUtilErr_) {
        *local_60 = 0;
LAB_001118d4:
        *local_38 = iVar5;
        return uVar7;
      }
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3934\n"
                       );
      uVar7 = paUtilErr_;
      goto LAB_0011186f;
    }
    if (((*local_60 == 0) || ((self->capture).ready != 0)) || ((self->playback).ready != 0))
    goto LAB_001118d4;
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3942\n"
                     );
    uVar7 = 0xffffd8fe;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds ) );
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds ) );
            totalFds += self->playback.nfds;
        }

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            /* To allow 'Abort' to terminate the callback thread, enable cancelability just for poll() (& disable after) */
            pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, NULL );
        }
#endif

        pollResults = poll( self->pfds, totalFds, pollTimeout );

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
        }
#endif

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}